

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O2

void __thiscall MemoryFile_CrazyWriteSize_Test::TestBody(MemoryFile_CrazyWriteSize_Test *this)

{
  bool bVar1;
  AssertHelper local_c0 [2];
  AssertionResult gtest_ar;
  char *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  char local_78 [16];
  buffer buffer;
  not_null<const_void_*> local_58;
  in_memory mf;
  
  anon_unknown.dwarf_146a0::MemoryFile::make_buffer
            ((MemoryFile *)&buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>,10)
  ;
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[8] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[9] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6] = '\0';
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[7] = '\0';
  std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<unsigned_char,void>
            ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&local_88,
             &buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
  pstore::file::in_memory::in_memory(&mf,(shared_ptr<void> *)&local_88,10,0,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  local_88 = (char *)CONCAT44(local_88._4_4_,0xffffffff);
  pstore::file::file_base::write<unsigned_int,void>(&mf.super_file_base,(uint *)&local_88);
  pstore::file::in_memory::seek(&mf,4);
  std::_V2::generic_category();
  local_88 = local_78;
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_58.ptr_ = "Hello";
    pstore::gsl::not_null<const_void_*>::ensure_invariant(&local_58);
    pstore::file::in_memory::write_buffer(&mf,local_58,0xfffffffffffffffd);
  }
  std::__cxx11::string::assign((char *)&local_88);
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (local_c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,local_88);
  testing::internal::AssertHelper::operator=(local_c0,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(local_c0);
  if (gtest_ar._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&local_88);
  pstore::file::in_memory::~in_memory(&mf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST_F (MemoryFile, CrazyWriteSize) {
    constexpr std::size_t elements = 10;
    auto buffer = MemoryFile::make_buffer (elements);
    std::fill (buffer.get (), buffer.get () + elements, std::uint8_t{0});
    pstore::file::in_memory mf (buffer, elements);

    mf.write (std::numeric_limits<std::uint32_t>::max ());
    mf.seek (4);
    constexpr auto length = std::numeric_limits<std::size_t>::max () - std::size_t{2};
    char const * source = "Hello";
    check_for_error ([&] { mf.write_buffer (source, length); }, std::errc::invalid_argument);
}